

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void assign_adjust(LexState *ls,BCReg nvars,BCReg nexps,ExpDesc *e)

{
  FuncState *fs;
  BCReg n;
  BCReg BVar1;
  
  fs = ls->fs;
  n = nvars - nexps;
  if (e->k != VVOID) {
    if (e->k == VCALL) {
      BVar1 = 0xffffffff;
      if (-1 < (int)n) {
        BVar1 = n;
      }
      *(char *)((long)&fs->bcbase[(e->u).s.info].ins + 3) = (char)BVar1 + '\x02';
      if ((int)n < 1) {
        return;
      }
      bcreg_reserve(fs,BVar1);
      return;
    }
    expr_tonextreg(fs,e);
  }
  if ((int)n < 1) {
    return;
  }
  BVar1 = fs->freereg;
  bcreg_reserve(fs,n);
  bcemit_nil(fs,BVar1,n);
  return;
}

Assistant:

static void assign_adjust(LexState *ls, BCReg nvars, BCReg nexps, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  int32_t extra = (int32_t)nvars - (int32_t)nexps;
  if (e->k == VCALL) {
    extra++;  /* Compensate for the VCALL itself. */
    if (extra < 0) extra = 0;
    setbc_b(bcptr(fs, e), extra+1);  /* Fixup call results. */
    if (extra > 1) bcreg_reserve(fs, (BCReg)extra-1);
  } else {
    if (e->k != VVOID)
      expr_tonextreg(fs, e);  /* Close last expression. */
    if (extra > 0) {  /* Leftover LHS are set to nil. */
      BCReg reg = fs->freereg;
      bcreg_reserve(fs, (BCReg)extra);
      bcemit_nil(fs, reg, (BCReg)extra);
    }
  }
}